

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O1

void __thiscall validationinterface_tests::TestInterface::~TestInterface(TestInterface *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~TestInterface(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x50);
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual ~TestInterface()
    {
        if (m_on_destroy) m_on_destroy();
    }